

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinc_resampler.cc
# Opt level: O0

void __thiscall webrtc::SincResampler::Flush(SincResampler *this)

{
  pointer __s;
  SincResampler *this_local;
  
  this->virtual_source_idx_ = 0.0;
  this->buffer_primed_ = false;
  __s = std::unique_ptr<float[],_webrtc::AlignedFreeDeleter>::get(&this->input_buffer_);
  memset(__s,0,this->input_buffer_size_ << 2);
  UpdateRegions(this,false);
  return;
}

Assistant:

void SincResampler::Flush() {
  virtual_source_idx_ = 0;
  buffer_primed_ = false;
  memset(input_buffer_.get(), 0,
         sizeof(*input_buffer_.get()) * input_buffer_size_);
  UpdateRegions(false);
}